

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O0

bool mserialize::detail::singular_impl(string_view full_tag,string_view tag,int max_recursion)

{
  string_view tag_00;
  string_view full_tag_00;
  string_view full_tag_01;
  bool bVar1;
  runtime_error *this;
  const_reference pcVar2;
  undefined8 in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  int in_R8D;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string_view *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84 [12];
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  string_view in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (in_R8D == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    string_view::to_string_abi_cxx11_(in_stack_ffffffffffffff68);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    std::runtime_error::runtime_error(this,local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = string_view::empty((string_view *)&stack0xffffffffffffffd8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    pcVar2 = string_view::front((string_view *)&stack0xffffffffffffffd8);
    if (*pcVar2 == '(') {
      full_tag_00._4_12_ = in_stack_ffffffffffffff84;
      full_tag_00._ptr._0_4_ = in_stack_ffffffffffffff80;
      tag_00._len = in_RSI;
      tag_00._ptr = in_RDI;
      local_1 = singular_tuple(full_tag_00,tag_00,(int)((ulong)in_RCX >> 0x20));
    }
    else if (*pcVar2 == '{') {
      full_tag_01._ptr._4_4_ = in_R8D;
      full_tag_01._ptr._0_4_ = in_stack_ffffffffffffffd0;
      full_tag_01._len = (size_t)in_RDX;
      local_1 = singular_struct(full_tag_01,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool singular_impl(string_view full_tag, string_view tag, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return true; }

  switch (tag.front())
  {
  case '(':
    return singular_tuple(full_tag, tag, max_recursion - 1);
  case '{':
    return singular_struct(full_tag, tag, max_recursion - 1);
  }

  return false;
}